

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

void tonk::MakeCallbacksOptional(TonkConnectionConfig *config)

{
  _func_void_TonkAppContextPtr_TonkConnection *p_Var1;
  _func_void_TonkAppContextPtr_TonkConnection_uint_uint8_t_ptr_uint *p_Var2;
  _func_void_TonkAppContextPtr_TonkConnection_uint64_t *p_Var3;
  _func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *p_Var4;
  long in_RDI;
  __3 local_c;
  __2 local_b;
  __1 local_a;
  __0 local_9;
  long local_8;
  
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 8) == 0) {
    p_Var1 = MakeCallbacksOptional(TonkConnectionConfig_t&)::$_0::operator_cast_to_function_pointer
                       (&local_9);
    *(_func_void_TonkAppContextPtr_TonkConnection **)(local_8 + 8) = p_Var1;
  }
  if (*(long *)(local_8 + 0x10) == 0) {
    p_Var2 = MakeCallbacksOptional(TonkConnectionConfig_t&)::$_1::operator_cast_to_function_pointer
                       (&local_a);
    *(_func_void_TonkAppContextPtr_TonkConnection_uint_uint8_t_ptr_uint **)(local_8 + 0x10) = p_Var2
    ;
  }
  if (*(long *)(local_8 + 0x18) == 0) {
    p_Var3 = MakeCallbacksOptional(TonkConnectionConfig_t&)::$_2::operator_cast_to_function_pointer
                       (&local_b);
    *(_func_void_TonkAppContextPtr_TonkConnection_uint64_t **)(local_8 + 0x18) = p_Var3;
  }
  if (*(long *)(local_8 + 0x20) == 0) {
    p_Var4 = MakeCallbacksOptional(TonkConnectionConfig_t&)::$_3::operator_cast_to_function_pointer
                       (&local_c);
    *(_func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr **)(local_8 + 0x20) = p_Var4;
  }
  return;
}

Assistant:

void MakeCallbacksOptional(TonkConnectionConfig& config)
{
    if (!config.OnConnect)
    {
        config.OnConnect = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/)
        {
            // No-op
        };
    }
    if (!config.OnData)
    {
        config.OnData = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/,
            unsigned          /*channel*/,
            const uint8_t*       /*data*/,
            unsigned            /*bytes*/)
        {
            // No-op
        };
    }
    if (!config.OnTick)
    {
        config.OnTick = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/,
            uint64_t /*nowUsec*/)
        {
            // No-op
        };
    }
    if (!config.OnClose)
    {
        config.OnClose = [](
            TonkAppContextPtr /*context*/,
            TonkConnection /*connection*/,
            TonkResult         /*reason*/,
            const char*    /*reasonJson*/)
        {
            // No-op
        };
    }
}